

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Type type;
  key_type kVar2;
  hasher *hf;
  hasher hVar3;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  value_type in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  value_type in_stack_fffffffffffff568;
  int index;
  undefined4 in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff574;
  key_equal *in_stack_fffffffffffff578;
  hasher *in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff588;
  Type in_stack_fffffffffffff58c;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff5e0;
  int local_7e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_7e0;
  Hasher local_7d0;
  Hasher local_7c4 [15];
  value_type local_710;
  int local_708;
  key_type local_704;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_700;
  Hasher local_6f0;
  Hasher local_6e4 [13];
  Type local_644;
  hasher *local_640;
  undefined4 local_634;
  AssertionResult local_630 [2];
  key_type local_60c;
  size_type local_608;
  undefined4 local_5fc;
  AssertionResult local_5f8 [2];
  size_type local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  size_type local_5a8;
  undefined4 local_59c;
  AssertionResult local_598 [2];
  hasher local_578;
  hasher local_568;
  int local_558;
  undefined4 local_554;
  AssertionResult local_550 [2];
  hasher local_530;
  hasher local_520;
  int local_510;
  undefined4 local_50c;
  AssertionResult local_508 [2];
  key_type local_4e8;
  key_type local_4e4;
  AssertionResult local_4e0 [2];
  key_type local_4c0;
  key_type local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_424;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  key_type local_3ec;
  size_type local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  key_type local_3b4;
  size_type local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0 [2];
  key_type local_37c;
  size_type local_378;
  undefined4 local_36c;
  AssertionResult local_368 [2];
  size_type local_348;
  undefined4 local_33c;
  AssertionResult local_338 [2];
  size_type local_318;
  undefined4 local_30c;
  AssertionResult local_308 [2];
  undefined4 local_2e4;
  size_type local_2e0;
  AssertionResult local_2d8 [2];
  size_type local_2b8;
  AssertionResult local_2b0 [2];
  key_equal local_290;
  key_equal local_280;
  int local_270;
  undefined4 local_26c;
  AssertionResult local_268 [2];
  key_equal local_248;
  key_equal local_238;
  int local_228;
  undefined4 local_224;
  AssertionResult local_220 [2];
  hasher local_200;
  hasher local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  AssertionResult local_1d8 [2];
  hasher local_1b8;
  hasher local_1a8;
  int local_198;
  undefined4 local_194;
  AssertionResult local_190 [2];
  key_type local_170;
  key_type local_16c;
  AssertionResult local_168 [2];
  key_type local_148;
  key_type local_144;
  AssertionResult local_140;
  size_type local_130;
  value_type local_fc;
  key_type local_f4;
  value_type local_c8;
  int local_c0;
  key_type local_bc;
  key_type local_b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_a8 [9];
  Hasher local_14;
  
  Hasher::Hasher(&local_14,1);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_a8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_a8);
  local_b8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  local_bc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_c0 = 3; local_c0 < 2000; local_c0 = local_c0 + 1) {
    local_c8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff558,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff5e0,
             (value_type *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  }
  local_f4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
          (key_type *)in_stack_fffffffffffff558);
  local_fc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff558,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff5e0,
           (value_type *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  local_130 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc0b8b);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff558);
  local_144 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_148 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc0bfa);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc0c72);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc0cd5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc0d46);
  local_16c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_170 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc0d7c);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc0e06);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc0e69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc0eda);
  local_194 = 1;
  local_1b8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_1a8 = local_1b8;
  local_198 = Hasher::id(&local_1a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc0fca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc102d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc109e);
  local_1dc = 0;
  local_200 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_1f0 = local_200;
  local_1e0 = Hasher::id(&local_1f0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc118a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc11ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc125e);
  local_224 = 1;
  local_248 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_238 = local_248;
  local_228 = Hasher::id(&local_238);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc134e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc13b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1422);
  local_26c = 0;
  local_290 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::key_eq((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_280 = local_290;
  local_270 = Hasher::id(&local_280);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc150e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc1571);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc15df);
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc15f0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (unsigned_long *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc167d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1751);
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbc175e);
  local_2e4 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (unsigned_long *)in_stack_fffffffffffff568,
             (uint *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc17f6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc1859);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc18ca);
  local_30c = 1;
  local_318 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc18e6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc1973);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc19d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1a47);
  local_33c = 0x7cc;
  local_348 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc1a5f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc1aec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc1b4f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1bc0);
  local_36c = 0;
  local_37c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_378 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc1ca5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc1d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1d79);
  local_3a4 = 1;
  local_3b4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_3b0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc1e4f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc1eb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc1f23);
  local_3dc = 1;
  local_3ec = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_3e8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc206b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc20dc);
  local_414 = 0;
  local_424 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_420 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc21b2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2215);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2286);
  local_44c = 0;
  local_45c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_458 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc236b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc23ce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc243f);
  local_484 = 0;
  local_494 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_490 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2515);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc25e9);
  google::
  swap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff558);
  local_4bc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc263e);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc26c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc272b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc279c);
  local_4e4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbc27d2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc285c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc28bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2930);
  local_50c = 0;
  local_530 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_520 = local_530;
  local_510 = Hasher::id(&local_520);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2a20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2a83);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2af4);
  local_554 = 1;
  hVar3 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_578 = hVar3;
  local_568 = hVar3;
  local_558 = Hasher::id(&local_568);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2be0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (hVar3._0_8_,(Message *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2c3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2cae);
  local_59c = 0x7cc;
  local_5a8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc2cca);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2d51);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (hVar3._0_8_,(Message *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2dae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2e1c);
  local_5cc = 1;
  local_5d8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbc2e34);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbc2ebb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (hVar3._0_8_,(Message *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc2f18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc2f89);
  local_5fc = 1;
  local_60c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_608 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    in_stack_fffffffffffff590 =
         (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbc305c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (hVar3._0_8_,(Message *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc30b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc312a);
  local_634 = 0;
  type = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                     in_stack_fffffffffffff568.second);
  local_644 = type;
  hf = (hasher *)
       google::
       BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               (key_type *)in_stack_fffffffffffff558);
  local_640 = hf;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    in_stack_fffffffffffff578 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xbc31f4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,type,(char *)hf,
               (int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (hVar3._0_8_,(Message *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbc3251);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc32c2);
  Hasher::Hasher(local_6e4,0);
  Hasher::Hasher(&local_6f0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_700,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(type,in_stack_fffffffffffff588),hf,
             in_stack_fffffffffffff578,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_700);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                      in_stack_fffffffffffff568.second);
  local_704 = kVar2;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_708 = 2; index = in_stack_fffffffffffff568.second, local_708 < 10000;
      local_708 = local_708 + 1) {
    in_stack_fffffffffffff568 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff558,0);
    local_710 = in_stack_fffffffffffff568;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(hVar3._0_8_,(value_type *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
  }
  Hasher::Hasher(local_7c4,0);
  Hasher::Hasher(&local_7d0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_7e0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(type,in_stack_fffffffffffff588),hf,
             in_stack_fffffffffffff578,(allocator_type *)CONCAT44(kVar2,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_7e0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff558);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(kVar2,in_stack_fffffffffffff570),index);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(kVar2,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_7e8 = 2; local_7e8 < 10000; local_7e8 = local_7e8 + 1) {
    in_stack_fffffffffffff558 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff558,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(hVar3._0_8_,(value_type *)CONCAT44(hVar3.num_compares_,in_stack_fffffffffffff5d8));
  }
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbc35b9);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbc35c6);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbc35d3);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}